

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_array_view.hpp
# Opt level: O0

span<const_long,_18446744073709551615UL> __thiscall jsoncons::typed_array_view::data(void *param_1)

{
  assertion_error *this;
  string *in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  span<const_long,_18446744073709551615UL> local_10;
  
  if (*param_1 != 8) {
    this = (assertion_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    assertion_error::assertion_error(this,in_stack_ffffffffffffff88);
    __cxa_throw(this,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  detail::span<const_long,_18446744073709551615UL>::span
            (&local_10,*(pointer *)((long)param_1 + 8),*(size_type *)((long)param_1 + 0x10));
  return local_10;
}

Assistant:

jsoncons::span<const int64_t> data(int64_array_arg_t) const
        {
            JSONCONS_ASSERT(type_ == typed_array_type::int64_value);
            return jsoncons::span<const int64_t>(data_.int64_data_, size_);
        }